

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::cleanAll(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
           *this)

{
  Size SVar1;
  Lit *pLVar2;
  char *pcVar3;
  int local_14;
  int i;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *this_local;
  
  local_14 = 0;
  while( true ) {
    SVar1 = vec<Minisat::Lit,_int>::size(&this->dirties);
    if (SVar1 <= local_14) break;
    pLVar2 = vec<Minisat::Lit,_int>::operator[](&this->dirties,local_14);
    pcVar3 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[]
                       (&this->dirty,(Lit)pLVar2->x);
    if (*pcVar3 != '\0') {
      pLVar2 = vec<Minisat::Lit,_int>::operator[](&this->dirties,local_14);
      clean(this,pLVar2);
    }
    local_14 = local_14 + 1;
  }
  vec<Minisat::Lit,_int>::clear(&this->dirties,false);
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[dirties[i]])
            clean(dirties[i]);
    dirties.clear();
}